

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O0

double __thiscall
singular::Svd<60,_50>::BidiagonalMatrix::applyRotatorFromLeft
          (BidiagonalMatrix *this,Rotator *r,int n,double bulge)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double g2;
  double newBulge;
  double r22;
  double r21;
  double r12;
  double r11;
  double b2;
  double g1;
  double b1;
  double *p;
  double bulge_local;
  int n_local;
  Rotator *r_local;
  BidiagonalMatrix *this_local;
  
  pdVar4 = this->pBlock + (n << 1);
  dVar1 = *pdVar4;
  dVar2 = pdVar4[1];
  dVar3 = pdVar4[2];
  dVar5 = Rotator::operator()(r,0,0);
  dVar6 = Rotator::operator()(r,0,1);
  dVar7 = Rotator::operator()(r,1,0);
  dVar8 = Rotator::operator()(r,1,1);
  *pdVar4 = dVar5 * dVar1 + dVar7 * bulge;
  pdVar4[1] = dVar5 * dVar2 + dVar7 * dVar3;
  pdVar4[2] = dVar6 * dVar2 + dVar8 * dVar3;
  if (n < 0x30) {
    g2 = dVar7 * pdVar4[3];
    pdVar4[3] = dVar8 * pdVar4[3];
  }
  else {
    g2 = 0.0;
  }
  return g2;
}

Assistant:

double applyRotatorFromLeft(const Rotator& r, int n, double bulge) {
				double* p = this->pBlock + n * 2;
				double b1 = p[0];
				double g1 = p[1];
				double b2 = p[2];
				double r11 = r(0, 0);
				double r12 = r(0, 1);
				double r21 = r(1, 0);
				double r22 = r(1, 1);
				p[0] = r11 * b1 + r21 * bulge;
				p[1] = r11 * g1 + r21 * b2;
				p[2] = r12 * g1 + r22 * b2;
				double newBulge;
				if (n < N - 2) {
					double g2 = p[3];
					newBulge = r21 * g2;
					p[3] = r22 * g2;
				} else {
					newBulge = 0.0;
				}
				return newBulge;
			}